

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O1

bool runCase(int testCase)

{
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *__x;
  uint i_4;
  uint uVar4;
  uint i_1;
  int iVar5;
  uint i;
  int iVar6;
  bool bVar7;
  DenseGraph g;
  DenseGraph g2;
  DenseGraph g2_1;
  DenseGraph local_d8;
  DenseGraph local_a0;
  DenseGraph local_68;
  
  switch(testCase) {
  case 1:
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 3;
    local_a0.t = false;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_a0.s._M_t);
    DenseGraph::AddEdge(&local_d8,0,1);
    bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if (!bVar7) {
      __x = &local_d8.s;
      goto LAB_001024ed;
    }
    bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,0);
    __x = &local_d8.s;
    goto LAB_00101329;
  case 2:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 4;
    local_a0.t = false;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DenseGraph::AddEdge(&local_a0,0,1);
    DenseGraph::AddEdge(&local_a0,0,2);
    DenseGraph::AddEdge(&local_a0,1,2);
    DenseGraph::AddEdge(&local_a0,1,3);
    bVar7 = DenseGraph::DoesEdgeExist(&local_a0,0,1);
    if ((((bVar7) && (bVar7 = DenseGraph::DoesEdgeExist(&local_a0,0,2), bVar7)) &&
        (bVar7 = DenseGraph::DoesEdgeExist(&local_a0,1,2), bVar7)) &&
       ((bVar7 = DenseGraph::DoesEdgeExist(&local_a0,1,3), bVar7 &&
        (bVar7 = DenseGraph::DoesEdgeExist(&local_a0,0,3), !bVar7)))) {
      bVar7 = DenseGraph::DoesEdgeExist(&local_a0,1,0);
LAB_00101bd1:
      __x = &local_a0.s;
LAB_00101329:
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&__x->_M_t);
      if (bVar7 != false) {
        return false;
      }
      return true;
    }
    goto LAB_001024e8;
  case 3:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 4;
    local_a0.t = false;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    DenseGraph::AddEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,2);
    DenseGraph::AddEdge(&local_d8,1,2);
    DenseGraph::AddEdge(&local_d8,1,3);
    bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if (((bVar7) && (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,2), bVar7)) &&
       ((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,2), bVar7 &&
        ((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,3), bVar7 &&
         (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,3), !bVar7)))))) {
      bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,0);
LAB_001017b9:
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&local_d8.s._M_t);
      goto LAB_00101bd1;
    }
    goto LAB_001024de;
  case 4:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 4;
    local_a0.t = false;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    DenseGraph::AddEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,2);
    DenseGraph::AddEdge(&local_d8,1,2);
    DenseGraph::AddEdge(&local_d8,1,3);
    DenseGraph::AddEdge(&local_d8,2,3);
    DenseGraph::AddEdge(&local_d8,1,0);
    DenseGraph::RemoveEdge(&local_d8,1,0);
    DenseGraph::AddEdge(&local_d8,0,3);
    DenseGraph::RemoveEdge(&local_d8,0,3);
    DenseGraph::AddEdge(&local_d8,3,2);
    DenseGraph::RemoveEdge(&local_d8,3,2);
    DenseGraph::AddEdge(&local_d8,3,3);
    bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if (((bVar7) && (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,2), bVar7)) &&
       ((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,2), bVar7 &&
        ((((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,3), bVar7 &&
           (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,2,3), bVar7)) &&
          (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,3,3), bVar7)) &&
         ((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,3), !bVar7 &&
          (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,0), !bVar7)))))))) {
      bVar7 = DenseGraph::DoesEdgeExist(&local_d8,3,2);
      goto LAB_001017b9;
    }
LAB_001024de:
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_d8.s._M_t);
LAB_001024e8:
    __x = &local_a0.s;
LAB_001024ed:
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&__x->_M_t);
    return false;
  case 5:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 5;
    local_a0.t = false;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8.t = false;
    local_d8.n = 5;
    this = &local_d8.s;
    __x = &local_a0.s;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::operator=(&this->_M_t,&__x->_M_t);
    DenseGraph::RemoveEdge(&local_d8,1,2);
    DenseGraph::RemoveEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,2);
    DenseGraph::AddEdge(&local_d8,1,2);
    DenseGraph::RemoveEdge(&local_d8,1,3);
    DenseGraph::AddEdge(&local_d8,1,3);
    DenseGraph::RemoveEdge(&local_d8,4,2);
    DenseGraph::AddEdge(&local_d8,4,2);
    DenseGraph::RemoveEdge(&local_d8,1,0);
    DenseGraph::AddEdge(&local_d8,0,3);
    DenseGraph::RemoveEdge(&local_d8,0,3);
    DenseGraph::AddEdge(&local_d8,3,2);
    DenseGraph::RemoveEdge(&local_d8,3,2);
    bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if ((((bVar7) && (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,2), bVar7)) &&
        (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,2), bVar7)) &&
       (((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,3), bVar7 &&
         (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,4,2), bVar7)) &&
        ((bVar7 = DenseGraph::DoesEdgeExist(&local_d8,0,3), !bVar7 &&
         (bVar7 = DenseGraph::DoesEdgeExist(&local_d8,1,0), !bVar7)))))) {
      bVar7 = DenseGraph::DoesEdgeExist(&local_d8,2,4);
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&this->_M_t);
      goto LAB_00101329;
    }
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&this->_M_t);
    goto LAB_001024ed;
  case 6:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar6 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 0x14;
    local_a0.t = false;
    iVar5 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar5 + 0x7d83U ^ 0x1312a) % 0x14,
                          (iVar6 * iVar5 + 0x3baa5aU ^ iVar5 + 0x20423U) % 0x14);
      iVar5 = iVar5 + 1;
      iVar6 = iVar6 + 0xc27;
    } while (iVar5 != 100);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(uVar4 + 0x7d83 ^ 0x1312a) % 0x14,
                         (iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 0x14);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024de;
        break;
      }
      bVar7 = 0x62 < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 100);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 0x14,
                         (uVar4 + 0x7d83 ^ 0x1312a) % 0x14);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024d4;
        break;
      }
      bVar7 = 0x62 < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 100);
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = false;
      uVar3 = 0;
      do {
        bVar2 = DenseGraph::DoesEdgeExist(&local_d8,uVar4,uVar3);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (!bVar2) {
LAB_00102373:
            if (!bVar1) goto LAB_001024f6;
            break;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (bVar2) goto LAB_00102373;
        }
        bVar1 = 0x12 < uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 0x14);
      bVar7 = 0x12 < uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x14);
    break;
  case 7:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar5 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 0x79;
    local_a0.t = false;
    iVar6 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar6 + 0x7d83U ^ 0x1312a) % 0x79,
                          (iVar5 * iVar6 + 0x3baa5aU ^ iVar6 + 0x20423U) % 0x79);
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (iVar6 != 1000);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(uVar4 + 0x7d83 ^ 0x1312a) % 0x79,
                         (iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 0x79);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024de;
        break;
      }
      bVar7 = 0x3e6 < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 1000);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 0x79,
                         (uVar4 + 0x7d83 ^ 0x1312a) % 0x79);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024d4;
        break;
      }
      bVar7 = 0x3e6 < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 1000);
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = false;
      uVar3 = 0;
      do {
        bVar2 = DenseGraph::DoesEdgeExist(&local_d8,uVar4,uVar3);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (!bVar2) {
LAB_00102402:
            if (!bVar1) goto LAB_001024f6;
            break;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (bVar2) goto LAB_00102402;
        }
        bVar1 = 0x77 < uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 0x79);
      bVar7 = 0x77 < uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x79);
    break;
  case 8:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar5 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 1000;
    local_a0.t = false;
    iVar6 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar6 + 0x7d83U ^ 0x1312a) % 1000,
                          (iVar5 * iVar6 + 0x3baa5aU ^ iVar6 + 0x20423U) % 1000);
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (iVar6 != 100000);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(uVar4 + 0x7d83 ^ 0x1312a) % 1000,
                         (iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 1000);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024de;
        break;
      }
      bVar7 = 0x1869e < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 100000);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 1000,
                         (uVar4 + 0x7d83 ^ 0x1312a) % 1000);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024d4;
        break;
      }
      bVar7 = 0x1869e < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 100000);
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = false;
      uVar3 = 0;
      do {
        bVar2 = DenseGraph::DoesEdgeExist(&local_d8,uVar4,uVar3);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (!bVar2) {
LAB_001022df:
            if (!bVar1) goto LAB_001024f6;
            break;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (bVar2) goto LAB_001022df;
        }
        bVar1 = 0x3e6 < uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 1000);
      bVar7 = 0x3e6 < uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 1000);
    break;
  case 9:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar5 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 1000;
    local_a0.t = false;
    iVar6 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar4 = (iVar6 + 0x7d83U ^ 0x1312a) % 1000;
      uVar3 = (iVar5 * iVar6 + 0x3baa5aU ^ iVar6 + 0x20423U) % 1000;
      DenseGraph::AddEdge(&local_a0,uVar4,uVar3);
      DenseGraph::RemoveEdge(&local_a0,uVar4,uVar3);
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (iVar6 != 100);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(uVar4 + 0x7d83 ^ 0x1312a) % 1000,
                         (iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 1000);
      if (bVar1) goto LAB_00102500;
      bVar7 = 0x62 < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 100);
    goto LAB_001024be;
  case 10:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar5 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 999;
    local_a0.t = false;
    iVar6 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar6 + 0x7d83U ^ 0x1312a) % 999,
                          (iVar5 * iVar6 + 0x3baa5aU ^ iVar6 + 0x20423U) % 999);
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (iVar6 != 200000);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    local_d8.t = (bool)(local_d8.t ^ 1);
    DenseGraph::DenseGraph(&local_68,&local_d8);
    local_a0.t = (bool)(local_68.t ^ 1);
    local_a0.n = local_68.n;
    local_68.t = local_a0.t;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::operator=(&local_a0.s._M_t,&local_68.s._M_t);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_68.s._M_t);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_a0,(uVar4 + 0x7d83 ^ 0x1312a) % 999,
                         (iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 999);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024de;
        break;
      }
      bVar7 = 0x30d3e < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 200000);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar5 = 0;
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar5 * uVar4 + 0x3baa5a ^ uVar4 + 0x20423) % 999,
                         (uVar4 + 0x7d83 ^ 0x1312a) % 999);
      if (!bVar1) {
        if (!bVar7) goto LAB_001024d4;
        break;
      }
      bVar7 = 0x30d3e < uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 0xc27;
    } while (uVar4 != 200000);
    bVar7 = false;
    uVar4 = 0;
    do {
      bVar1 = false;
      uVar3 = 0;
      do {
        bVar2 = DenseGraph::DoesEdgeExist(&local_a0,uVar4,uVar3);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (!bVar2) {
LAB_00102495:
            if (!bVar1) goto LAB_001024f6;
            break;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist(&local_68,uVar3,uVar4);
          if (bVar2) goto LAB_00102495;
        }
        bVar1 = 0x3e5 < uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 999);
      bVar7 = 0x3e5 < uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 999);
    break;
  default:
    goto LAB_0010251c;
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_68.s._M_t);
LAB_001024be:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_d8.s._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_a0.s._M_t);
LAB_0010251c:
  return true;
LAB_001024d4:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_68.s._M_t);
  goto LAB_001024de;
LAB_001024f6:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_68.s._M_t);
LAB_00102500:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_d8.s._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_a0.s._M_t);
  if (!bVar7) {
    return false;
  }
  return true;
}

Assistant:

bool runCase(int testCase) {
    if (testCase == 1) {
        DenseGraph g;
        g.AddEdge(0,1);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 2) {
        DenseGraph g(4);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 3) {
        DenseGraph g2(4);
        DenseGraph g(g2);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 4) {
        DenseGraph g2(4);
        DenseGraph g = g2;
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        g.AddEdge(2,3);
        g.AddEdge(1,0);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);
        g.AddEdge(3,3);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(2,3)) return false;
        if (!g.DoesEdgeExist(3,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(3,2)) return false;


    } else
    if (testCase == 5) {
        DenseGraph g2(5);
        DenseGraph g(2);
        g = g2;
        g.RemoveEdge(1,2);
        g.RemoveEdge(0,1);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.RemoveEdge(1,3);
        g.AddEdge(1,3);
        g.RemoveEdge(4,2);
        g.AddEdge(4,2);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(4,2)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(2,4)) return false;
    } else
    if (testCase == 6) {
        int n = 20;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }


    } else
    if (testCase == 7) {
        int n = 121;
        int k = 1000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 8) {
        int n = 1000;
        int k = 100000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 9) {
        int n = 1000;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
            gt.RemoveEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (g.DoesEdgeExist(a,b)) return false;
        }
    } else
    if (testCase == 10) {
        int n = 999;
        int k = 200000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt.Transpose();
        gt = g.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!gt.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (gt.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    }
    return true;
}